

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QVariant>::emplace<QVariant_const&>
          (QHash<QString,QVariant> *this,QString *key,QVariant *args)

{
  Data<QHashPrivate::Node<QString,_QVariant>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
LAB_001a92c7:
    pDVar1 = (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0;
LAB_001a92e8:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar1;
LAB_001a92f0:
    pVar2 = (piter)emplace_helper<QVariant_const&>(this,key,args);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_48.shared);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_48.shared = (PrivateShared *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0) goto LAB_001a92c7;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_001a92e8;
      goto LAB_001a92f0;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QVariant_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_001a935a;
    }
    QVariant::QVariant((QVariant *)&local_48,args);
    pVar2 = (piter)QHash<QString,_QVariant>::emplace_helper<QVariant>
                             ((QHash<QString,_QVariant> *)this,key,(QVariant *)&local_48);
    QVariant::~QVariant((QVariant *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_001a935a:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }